

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoolSimp.cpp
# Opt level: O1

bool __thiscall Inferences::BoolSimp::areComplements(BoolSimp *this,TermList t1,TermList t2)

{
  bool bVar1;
  TermList head;
  TermList local_20;
  
  if (areComplements(Kernel::TermList,Kernel::TermList)::args == '\0') {
    areComplements();
  }
  local_20._content = 2;
  ApplicativeHelper::getHeadAndArgs(t1,&local_20,&areComplements::args);
  if ((((local_20._content & 1) != 0) ||
      (*(int *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x60) +
                         (ulong)*(uint *)(local_20._content + 8) * 8) + 0x44) != 7)) ||
     (bVar1 = true, (areComplements::args._stack)->_content != t2._content)) {
    ApplicativeHelper::getHeadAndArgs(t2,&local_20,&areComplements::args);
    if ((((local_20._content & 1) != 0) ||
        (*(int *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x60) +
                           (ulong)*(uint *)(local_20._content + 8) * 8) + 0x44) != 7)) ||
       (bVar1 = true, (areComplements::args._stack)->_content != t1._content)) {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool BoolSimp::areComplements(TermList t1, TermList t2){
  Signature::Symbol* sym;
  static TermStack args;
  TermList head;

  ApplicativeHelper::getHeadAndArgs(t1, head, args);
  if(!head.isVar()){
    sym = env.signature->getFunction(head.term()->functor());
    if(sym->proxy() == Signature::NOT){
      ASS(args.size() == 1);
      if(args[0] == t2){ return true;}
    }
  }

  ApplicativeHelper::getHeadAndArgs(t2, head, args);
  if(!head.isVar()){
    sym = env.signature->getFunction(head.term()->functor());
    if(sym->proxy() == Signature::NOT){
      ASS(args.size() == 1);
      if(args[0] == t1){ return true;}
    }
  }

  return false;
}